

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::processFunctions(TranslateToFuzzReader *this)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Function_*,_false> _Var2;
  pointer puVar3;
  pointer puVar4;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> uVar5;
  Builder *this_00;
  pointer ppFVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  long lVar9;
  undefined8 *puVar10;
  value_type *pvVar11;
  Call *left;
  Block *pBVar12;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  long extraout_RDX;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar13;
  ulong uVar14;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  undefined1 auVar15 [8];
  Random *this_01;
  uint uVar16;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_2;
  ulong uVar17;
  Name NVar18;
  optional<wasm::Type> type;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_a8;
  Builder *local_90;
  Random *local_88;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> noParamsOrResultFuncs;
  undefined1 auStack_58 [8];
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> moddable;
  
  auStack_58 = (undefined1  [8])0x0;
  moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar13 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar6 = moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                _M_impl.super__Vector_impl_data._M_start, puVar13 != puVar1; puVar13 = puVar13 + 1)
  {
    _Var2._M_head_impl =
         (puVar13->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
      auStack_78 = (undefined1  [8])_Var2._M_head_impl;
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)auStack_58,
                 (Function **)auStack_78);
    }
  }
  puVar3 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (auVar15 = auStack_58; auVar15 != (undefined1  [8])ppFVar6;
      auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
    addInvocations(this,*(Function **)auVar15);
  }
  this_01 = &this->random;
  local_80 = (long)puVar3 - (long)puVar4 >> 3;
  uVar7 = Random::upTo(this_01,0xb);
LAB_0015c2a4:
  do {
    if ((this->random).finishedInput != false) {
      noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_78 = (undefined1  [8])0x0;
      noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      puVar1 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar13 = (this->wasm->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1;
          puVar13 = puVar13 + 1) {
        lVar9 = ::wasm::HeapType::getSignature();
        if (lVar9 == 0) {
          ::wasm::HeapType::getSignature();
          if (extraout_RDX == 0) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                       (value_type *)
                       (puVar13->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          }
        }
      }
      if (auStack_78 !=
          (undefined1  [8])
          noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_90 = &this->builder;
        uVar14 = local_80;
        local_88 = this_01;
        for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < uVar14; uVar16 = uVar16 + 1) {
          puVar3 = (this->wasm->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)puVar3[uVar17]._M_t + 0x10) == 0) {
            uVar8 = Random::upTo(this_01,10);
            if (uVar8 < uVar7) {
              uVar5._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = puVar3[uVar17]._M_t;
              if (*(char *)((long)uVar5._M_t.
                                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x28)
                  == '\0') {
                puVar10 = (undefined8 *)
                          ((long)uVar5._M_t.
                                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18);
              }
              else {
                puVar10 = (undefined8 *)0x0;
              }
              NVar18.super_IString.str._M_str = (char *)*puVar10;
              NVar18.super_IString.str._M_len = (size_t)this->wasm;
              lVar9 = ::wasm::Module::getFunction(NVar18);
              if (*(long *)(lVar9 + 0x20) == 0) {
                pvVar11 = Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                                    (this_01,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                             auStack_78);
                this_00 = local_90;
                local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                args = &local_a8;
                left = Builder::makeCall(local_90,(Name)(pvVar11->super_IString).str,
                                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                          *)args,(Type)0x0,false);
                std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                ~_Vector_base(&local_a8);
                type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)args;
                pBVar12 = Builder::makeSequence
                                    (this_00,(Expression *)left,*(Expression **)(lVar9 + 0x60),type)
                ;
                *(Block **)(lVar9 + 0x60) = pBVar12;
                uVar14 = local_80;
                this_01 = local_88;
              }
            }
          }
        }
      }
      if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
        puVar1 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar13 = (this->wasm->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1;
            puVar13 = puVar13 + 1) {
          _Var2._M_head_impl =
               (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if (*(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
            addHangLimitChecks(this,_Var2._M_head_impl);
          }
        }
      }
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78);
      std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                ((_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_58);
      return;
    }
    if (auStack_58 !=
        (undefined1  [8])
        moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar8 = Random::upTo(this_01,10);
      if (uVar8 < uVar7) {
        uVar8 = Random::upTo(this_01,(uint32_t)
                                     ((ulong)((long)moddable.
                                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_58) >> 3));
        modFunction(this,*(pointer)((long)auStack_58 + (ulong)uVar8 * 8));
        *(Function **)((long)auStack_58 + (ulong)uVar8 * 8) =
             moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start[-1];
        moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start + -1;
        goto LAB_0015c2a4;
      }
    }
    auStack_78 = (undefined1  [8])addFunction(this);
    addInvocations(this,(Function *)auStack_78);
    if (this->allowOOB == true) {
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_58,
                 (value_type *)auStack_78);
    }
  } while( true );
}

Assistant:

void TranslateToFuzzReader::processFunctions() {
  // Functions that are eligible for being modded. We only do so once to each
  // function, at most, so once we do we remove it from here.
  std::vector<Function*> moddable;

  // Defined initial functions are moddable.
  for (auto& func : wasm.functions) {
    if (!func->imported()) {
      moddable.push_back(func.get());
    }
  }

  auto numInitialExports = wasm.exports.size();

  // Add invocations, which can help execute the code here even if the function
  // was not exported (or was exported but with a signature that traps
  // immediately, like receiving a non-nullable ref, that the fuzzer can't
  // provide from JS). Note we cannot iterate on wasm.functions because
  // addInvocations modifies that.
  for (auto* func : moddable) {
    addInvocations(func);
  }

  // We do not want to always mod in the same frequency. Pick a chance to mod a
  // function. When the chance is maximal we will mod every single function, and
  // immediately after creating it; when the chance is minimal we will not mod
  // anything; values in the middle will end up randomly modding some functions,
  // at random times (random times are useful because we might create function
  // A, then B, then mod A, and since B has already been created, the modding of
  // A may lead to calls to B).
  const int RESOLUTION = 10;
  auto chance = upTo(RESOLUTION + 1);

  // Keep working while we have random data.
  while (!random.finished()) {
    if (!moddable.empty() && upTo(RESOLUTION) < chance) {
      // Mod an existing function.
      auto index = upTo(moddable.size());
      auto* func = moddable[index];
      modFunction(func);

      // Remove this function from the vector by swapping the last item to its
      // place, and truncating.
      moddable[index] = moddable.back();
      moddable.pop_back();
    } else {
      // Add a new function
      auto* func = addFunction();
      addInvocations(func);

      // It may be modded later, if we allow out-of-bounds: we emit OOB checks
      // in the code we just generated, and any changes could break that.
      if (allowOOB) {
        moddable.push_back(func);
      }
    }
  }

  // Interpose on initial exports. When initial content contains exports, it can
  // be useful to add new code that executes in them, rather than just adding
  // new exports later. To some extent modifying the initially-exported function
  // gives us that, but typically these are small changes, not calls to entirely
  // new code (and this is especially important when preserveImportsAndExports,
  // as in that mode we do not add new exports, so this interposing is our main
  // chance to run new code using the existing exports).
  //
  // Interpose with a call before the old code. We do a call here so that we end
  // up running a useful amount of new code (rather than just make(none) which
  // would only emit something local in the current function, and which depends
  // on its contents).
  // TODO: We could also interpose after, either in functions without results,
  //       or by saving the results to a temp local as we call.
  //
  // Specifically, we will call functions, for simplicity, with no params or
  // results. Such functions exist in abundance in general, because the
  // invocations we add look exactly that way. First, find all such functions,
  // and then find places to interpose calls to them.
  std::vector<Name> noParamsOrResultFuncs;
  for (auto& func : wasm.functions) {
    if (func->getParams() == Type::none && func->getResults() == Type::none) {
      noParamsOrResultFuncs.push_back(func->name);
    }
  }
  if (!noParamsOrResultFuncs.empty()) {
    for (Index i = 0; i < numInitialExports; i++) {
      auto& exp = wasm.exports[i];
      if (exp->kind == ExternalKind::Function && upTo(RESOLUTION) < chance) {
        auto* func = wasm.getFunction(*exp->getInternalName());
        if (!func->imported()) {
          auto* call =
            builder.makeCall(pick(noParamsOrResultFuncs), {}, Type::none);
          func->body = builder.makeSequence(call, func->body);
        }
      }
    }
  }

  // At the very end, add hang limit checks (so no modding can override them).
  if (fuzzParams->HANG_LIMIT > 0) {
    for (auto& func : wasm.functions) {
      if (!func->imported()) {
        addHangLimitChecks(func.get());
      }
    }
  }
}